

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloca.hpp
# Opt level: O0

void __thiscall
libtorrent::aux::alloca_destructor<libtorrent::aux::bandwidth_channel_*>::~alloca_destructor
          (alloca_destructor<libtorrent::aux::bandwidth_channel_*> *this)

{
  index_type iVar1;
  bandwidth_channel **ppbVar2;
  bandwidth_channel **o;
  bandwidth_channel **__end0;
  bandwidth_channel **__begin0;
  span<libtorrent::aux::bandwidth_channel_*> *__range4;
  alloca_destructor<libtorrent::aux::bandwidth_channel_*> *this_local;
  
  iVar1 = span<libtorrent::aux::bandwidth_channel_*>::size(&this->objects);
  if (iVar1 < 0x201) {
    __end0 = span<libtorrent::aux::bandwidth_channel_*>::begin(&this->objects);
    ppbVar2 = span<libtorrent::aux::bandwidth_channel_*>::end(&this->objects);
    for (; __end0 != ppbVar2; __end0 = __end0 + 1) {
    }
  }
  else {
    ppbVar2 = span<libtorrent::aux::bandwidth_channel_*>::data(&this->objects);
    if (ppbVar2 != (bandwidth_channel **)0x0) {
      operator_delete__(ppbVar2);
    }
  }
  return;
}

Assistant:

~alloca_destructor()
	{
		if (objects.size() > cutoff)
		{
			delete [] objects.data();
		}
		else
		{
			for (auto& o : objects)
			{
				TORRENT_UNUSED(o);
				o.~T();
			}
		}
	}